

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn2612.c
# Opt level: O1

void ym2612_reset_chip(void *chip)

{
  FM_OPN2 *OPN;
  long lVar1;
  undefined4 *puVar2;
  UINT8 *pUVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  
  if (*(uint *)((long)chip + 0x22c) == 0) {
    dVar9 = 0.0;
  }
  else {
    dVar9 = ((double)*(uint *)((long)chip + 0x228) / (double)*(uint *)((long)chip + 0x22c)) / 144.0;
  }
  OPN = (FM_OPN2 *)((long)chip + 0x208);
  uVar8 = -(ulong)(ABS(dVar9 + -1.0) < 5e-05);
  dVar9 = (double)(~uVar8 & (ulong)dVar9 | (ulong)((uint)(uVar8 >> 0x20) & 0x3ff00000) << 0x20);
  *(double *)((long)chip + 0x218) = dVar9;
  *(int *)((long)chip + 0x6c8) = (int)(long)(dVar9 * 65536.0);
  *(undefined4 *)((long)chip + 0x6cc) = 0x30000;
  *(int *)((long)chip + 0x46dc) = (int)(long)(dVar9 * 16777216.0);
  *(undefined4 *)((long)chip + 0x220) = 0x90;
  lVar1 = (long)chip + 0x44c;
  pUVar3 = "";
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      iVar7 = (int)((double)pUVar3[lVar6] * dVar9 * 64.0);
      *(int *)(lVar1 + -0x200 + lVar6 * 4) = iVar7;
      *(int *)(lVar1 + lVar6 * 4) = -iVar7;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x20);
    lVar4 = lVar4 + 1;
    lVar1 = lVar1 + 0x80;
    pUVar3 = pUVar3 + 0x20;
  } while (lVar4 != 4);
  puVar2 = (undefined4 *)((long)chip + 0x6d0);
  lVar1 = 0;
  do {
    *puVar2 = (int)(long)((double)(int)lVar1 * dVar9 * 64.0);
    lVar1 = lVar1 + 0x20;
    puVar2 = puVar2 + 1;
  } while (lVar1 != 0x20000);
  *(int *)((long)chip + 0x46d0) = (int)(long)(dVar9 * 131072.0 * 64.0);
  *(undefined1 *)((long)chip + 0x225) = 3;
  if ((*(char *)((long)chip + 0x224) == '\0') && ((*(byte *)((long)chip + 0x231) & 3) != 0)) {
    *(undefined1 *)((long)chip + 0x224) = 1;
    if (*(code **)((long)chip + 0x658) != (code *)0x0) {
      (**(code **)((long)chip + 0x658))(*(undefined8 *)((long)chip + 0x210));
    }
  }
  if ((*(char *)((long)chip + 0x224) != '\0') &&
     ((*(byte *)((long)chip + 0x231) & *(byte *)((long)chip + 0x225)) == 0)) {
    *(undefined1 *)((long)chip + 0x224) = 0;
    if (*(code **)((long)chip + 0x658) != (code *)0x0) {
      (**(code **)((long)chip + 0x658))(*(undefined8 *)((long)chip + 0x210));
    }
  }
  *(undefined8 *)((long)chip + 0x6c0) = 0;
  *(undefined4 *)((long)chip + 0x46d8) = 0;
  *(undefined1 *)((long)chip + 0x46d4) = 0;
  *(undefined8 *)((long)chip + 0x46e4) = 0x7e;
  *(undefined4 *)((long)chip + 0x240) = 0;
  *(undefined4 *)((long)chip + 0x248) = 0;
  *(undefined1 *)((long)chip + 0x684) = 0;
  *(undefined1 *)((long)chip + 0x231) = 0;
  *(undefined4 *)((long)chip + 0x234) = 0;
  memset((void *)((long)chip + 8),0,0x200);
  *(undefined4 *)((long)chip + 0x46e0) = 0;
  *(undefined4 *)((long)chip + 0x46d8) = 0;
  *(undefined1 *)((long)chip + 0x46d4) = 0;
  *(undefined8 *)((long)chip + 0x46e4) = 0x7e;
  OPNWriteMode(OPN,0x27,0x30);
  *(undefined1 *)((long)chip + 0x244) = 0;
  *(undefined4 *)((long)chip + 0x23c) = 0;
  lVar1 = (long)chip + 0x4762;
  lVar4 = 0;
  do {
    lVar6 = lVar4 * 0x198;
    *(undefined4 *)((long)chip + lVar6 + 0x4890) = 0;
    *(undefined8 *)((long)chip + lVar6 + 0x485c) = 0;
    *(undefined4 *)((long)chip + lVar6 + 0x489c) = 0;
    lVar6 = 0;
    do {
      *(long *)(lVar1 + -0x4a + lVar6) = (long)chip + 0x24c;
      *(undefined1 *)(lVar1 + lVar6) = 0;
      *(undefined8 *)(lVar1 + -0x26 + lVar6) = 0xffffffff00000000;
      *(undefined2 *)(lVar1 + -2 + lVar6) = 0;
      *(undefined1 *)(lVar1 + -0x1e + lVar6) = 0;
      *(undefined4 *)(lVar1 + -0x16 + lVar6) = 0x3ff;
      *(undefined4 *)(lVar1 + -0xe + lVar6) = 0x3ff;
      lVar6 = lVar6 + 0x50;
    } while (lVar6 != 0x140);
    lVar4 = lVar4 + 1;
    lVar1 = lVar1 + 0x198;
  } while (lVar4 != 6);
  uVar5 = 0xb7;
  do {
    uVar5 = uVar5 - 1;
    OPNWriteReg(OPN,uVar5,0xc0);
    OPNWriteReg(OPN,uVar5 | 0x100,0xc0);
  } while (0xb4 < uVar5);
  uVar5 = 0xb3;
  do {
    uVar5 = uVar5 - 1;
    OPNWriteReg(OPN,uVar5,0);
    OPNWriteReg(OPN,uVar5 | 0x100,0);
  } while (0x30 < uVar5);
  *(undefined2 *)((long)chip + 0x50a9) = 0;
  *(undefined4 *)((long)chip + 0x50ac) = 0;
  *(byte *)((long)chip + 0x50b1) = *(byte *)((long)chip + 0x50b1) >> 1;
  *(undefined8 *)((long)chip + 0x50b4) = 0;
  return;
}

Assistant:

void ym2612_reset_chip(void *chip)
{
	int i;
	YM2612 *F2612 = (YM2612 *)chip;
	FM_OPN2 *OPN  = &F2612->OPN;

	OPNSetPres( OPN, 6*24, 6*24, 0);
	/* status clear */
	FM_IRQMASK_SET(&OPN->ST,0x03);
	FM_BUSY_CLEAR(&OPN->ST);
	//OPNWriteMode(OPN,0x27,0x30); /* mode 0 , timer reset */

	OPN->eg_timer = 0;
	OPN->eg_cnt   = 0;

	OPN->lfo_timer = 0;
	OPN->lfo_cnt   = 0;
	OPN->LFO_AM    = 126;
	OPN->LFO_PM    = 0;

	OPN->ST.TAC    = 0;
	OPN->ST.TBC    = 0;

	OPN->SL3.key_csm = 0;

	OPN->ST.status = 0;
	OPN->ST.mode = 0;

	memset(F2612->REGS, 0x00, sizeof(UINT8) * 512);
	
	OPNWriteMode(OPN,0x22,0x00);
	
	OPNWriteMode(OPN,0x27,0x30);
	OPNWriteMode(OPN,0x26,0x00);
	OPNWriteMode(OPN,0x25,0x00);
	OPNWriteMode(OPN,0x24,0x00);

	reset_channels( &OPN->ST , &F2612->CH[0] , 6 );

	for(i = 0xb6 ; i >= 0xb4 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0xc0);
		OPNWriteReg(OPN,i|0x100,0xc0);
	}
	for(i = 0xb2 ; i >= 0x30 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0);
		OPNWriteReg(OPN,i|0x100,0);
	}

	/* DAC mode clear */
	F2612->dacen = 0;
	F2612->dac_test = 0;
	F2612->dacout = 0;
	
	F2612->WaveOutMode >>= 1;
	F2612->WaveL = F2612->WaveR = 0;
}